

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.hpp
# Opt level: O2

HVector * __thiscall Basis::vec2hvec(Basis *this,QpVector *vec)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  long lVar6;
  
  HVectorBase<double>::clear(&this->buffer_vec2hvec);
  piVar2 = (vec->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (vec->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->buffer_vec2hvec).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->buffer_vec2hvec).array.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 < vec->num_nz; lVar6 = lVar6 + 1) {
    iVar1 = piVar2[lVar6];
    piVar4[lVar6] = iVar1;
    pdVar5[iVar1] = pdVar3[iVar1];
  }
  (this->buffer_vec2hvec).count = vec->num_nz;
  (this->buffer_vec2hvec).packFlag = true;
  return &this->buffer_vec2hvec;
}

Assistant:

HVector& vec2hvec(const QpVector& vec) {
    buffer_vec2hvec.clear();
    for (HighsInt i = 0; i < vec.num_nz; i++) {
      buffer_vec2hvec.index[i] = vec.index[i];
      buffer_vec2hvec.array[vec.index[i]] = vec.value[vec.index[i]];
    }
    buffer_vec2hvec.count = vec.num_nz;
    buffer_vec2hvec.packFlag = true;
    return buffer_vec2hvec;
  }